

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_enumerator.cpp
# Opt level: O1

SharedLiterals * __thiscall
Clasp::CBConsequences::SharedConstraint::fetch_if_neq(SharedConstraint *this,SharedLiterals *last)

{
  int iVar1;
  SharedLiterals *pSVar2;
  
  LOCK();
  iVar1 = (this->mutex).super___atomic_base<int>._M_i;
  (this->mutex).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  while (iVar1 != 0) {
    sched_yield();
    LOCK();
    iVar1 = (this->mutex).super___atomic_base<int>._M_i;
    (this->mutex).super___atomic_base<int>._M_i = 1;
    UNLOCK();
  }
  if (this->current == last) {
    pSVar2 = (SharedLiterals *)0x0;
  }
  else {
    pSVar2 = SharedLiterals::share(this->current);
  }
  LOCK();
  (this->mutex).super___atomic_base<int>._M_i = 0;
  UNLOCK();
  return pSVar2;
}

Assistant:

SharedLiterals* fetch_if_neq(SharedLiterals* last) const {
		ACQUIRE_LOCK(mutex);
		SharedLiterals* ret = last != current ? current->share() : 0;
		RELEASE_LOCK(mutex);
		return ret;
	}